

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::SetClosureRegisters
          (ByteCodeGenerator *this,FuncInfo *funcInfo,FunctionBody *byteCodeFunction)

{
  if (funcInfo->frameDisplayRegister != 0xffffffff) {
    Js::FunctionBody::MapAndSetLocalFrameDisplayRegister
              (byteCodeFunction,funcInfo->frameDisplayRegister);
  }
  if (funcInfo->frameObjRegister == 0xffffffff) {
    if (funcInfo->frameSlotsRegister != 0xffffffff) {
      Js::FunctionBody::MapAndSetLocalClosureRegister(byteCodeFunction,funcInfo->frameSlotsRegister)
      ;
    }
  }
  else {
    Js::FunctionBody::MapAndSetLocalClosureRegister(byteCodeFunction,funcInfo->frameObjRegister);
    byteCodeFunction->hasScopeObject = true;
  }
  if (funcInfo->paramSlotsRegister != 0xffffffff) {
    Js::FunctionBody::MapAndSetParamClosureRegister(byteCodeFunction,funcInfo->paramSlotsRegister);
    return;
  }
  return;
}

Assistant:

void ByteCodeGenerator::SetClosureRegisters(FuncInfo* funcInfo, Js::FunctionBody* byteCodeFunction)
{
    if (funcInfo->frameDisplayRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->MapAndSetLocalFrameDisplayRegister(funcInfo->frameDisplayRegister);
    }

    if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->MapAndSetLocalClosureRegister(funcInfo->frameObjRegister);
        byteCodeFunction->SetHasScopeObject(true);
    }
    else if (funcInfo->frameSlotsRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->MapAndSetLocalClosureRegister(funcInfo->frameSlotsRegister);
    }

    if (funcInfo->paramSlotsRegister != Js::Constants::NoRegister)
    {
        byteCodeFunction->MapAndSetParamClosureRegister(funcInfo->paramSlotsRegister);
    }
}